

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void HistoQueueUpdateHead(HistoQueue *histo_queue,HistogramPair *pair)

{
  HistogramPair *pHVar1;
  uint64_t uVar2;
  int64_t iVar3;
  int64_t iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  HistogramPair tmp;
  
  pHVar1 = histo_queue->queue;
  if (pair->cost_diff < pHVar1->cost_diff) {
    uVar2 = pHVar1->cost_combo;
    iVar6 = pHVar1->idx1;
    iVar7 = pHVar1->idx2;
    iVar3 = pHVar1->cost_diff;
    pHVar1->cost_combo = pair->cost_combo;
    iVar5 = pair->idx2;
    iVar4 = pair->cost_diff;
    pHVar1->idx1 = pair->idx1;
    pHVar1->idx2 = iVar5;
    pHVar1->cost_diff = iVar4;
    pair->cost_combo = uVar2;
    pair->idx1 = iVar6;
    pair->idx2 = iVar7;
    pair->cost_diff = iVar3;
  }
  return;
}

Assistant:

static void HistoQueueUpdateHead(HistoQueue* const histo_queue,
                                 HistogramPair* const pair) {
  assert(pair->cost_diff < 0);
  assert(pair >= histo_queue->queue &&
         pair < (histo_queue->queue + histo_queue->size));
  assert(histo_queue->size > 0);
  if (pair->cost_diff < histo_queue->queue[0].cost_diff) {
    // Replace the best pair.
    const HistogramPair tmp = histo_queue->queue[0];
    histo_queue->queue[0] = *pair;
    *pair = tmp;
  }
}